

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void GA_Step_max_patch(int g_a,int *alo,int *ahi,int g_b,int *blo,int *bhi,void *step)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  long in_R9;
  Integer *in_stack_00000008;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  Integer ndim;
  Integer b;
  Integer a;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  long local_148 [8];
  long local_108 [8];
  long local_c8 [8];
  long local_88 [8];
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_18;
  long local_10;
  
  local_38 = (long)in_EDI;
  local_40 = (long)in_ECX;
  local_30 = in_R9;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_48 = pnga_ndim(_ga_blo[6]);
  for (local_14c = 0; local_14c < local_48; local_14c = local_14c + 1) {
    local_88[(local_48 - local_14c) + -1] = (long)*(int *)(local_10 + (long)local_14c * 4) + 1;
  }
  for (local_150 = 0; local_150 < local_48; local_150 = local_150 + 1) {
    local_c8[(local_48 - local_150) + -1] = (long)*(int *)(local_18 + (long)local_150 * 4) + 1;
  }
  for (local_154 = 0; local_154 < local_48; local_154 = local_154 + 1) {
    local_108[(local_48 - local_154) + -1] = (long)*(int *)(local_28 + (long)local_154 * 4) + 1;
  }
  for (local_158 = 0; local_158 < local_48; local_158 = local_158 + 1) {
    local_148[(local_48 - local_158) + -1] = (long)*(int *)(local_30 + (long)local_158 * 4) + 1;
  }
  pnga_step_max_patch(_ga_bhi[2],(Integer *)_ga_bhi[1],(Integer *)_ga_bhi[0],_i_1,_i_3,
                      in_stack_00000008,(void *)_ga_bhi[4]);
  return;
}

Assistant:

void GA_Step_max_patch(int g_a, int alo[], int ahi[], int g_b, int blo[], int bhi[], void *step)
{
    Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;
    Integer ndim = wnga_ndim(a);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, ndim);
    COPYINDEX_C2F(ahi,_ga_ahi, ndim);
    COPYINDEX_C2F(blo,_ga_blo, ndim);
    COPYINDEX_C2F(bhi,_ga_bhi, ndim);
    wnga_step_max_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi, step);
}